

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

TestStatus *
vkt::pipeline::anon_unknown_0::testRenderToMipMaps
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict *caseDef)

{
  pointer *this;
  VkFormat VVar1;
  VkImage colorImage_00;
  VkImage depthStencilImage_00;
  VkBuffer vertexBuffer_00;
  VkPipelineLayout pipelineLayout_00;
  VkShaderModule vertexModule_00;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_02;
  RefData<vk::Handle<(vk::HandleType)8>_> data_03;
  RefData<vk::Handle<(vk::HandleType)14>_> data_04;
  RefData<vk::Handle<(vk::HandleType)14>_> data_05;
  RefData<vk::Handle<(vk::HandleType)16>_> data_06;
  RefData<vk::Handle<(vk::HandleType)9>_> data_07;
  RefData<vk::Handle<(vk::HandleType)9>_> data_08;
  RefData<vk::Handle<(vk::HandleType)8>_> data_09;
  RefData<vk::Handle<(vk::HandleType)24>_> data_10;
  RefData<vk::VkCommandBuffer_s_*> data_11;
  RefData<vk::Handle<(vk::HandleType)24>_> data_12;
  RefData<vk::VkCommandBuffer_s_*> data_13;
  undefined8 uVar4;
  bool bVar5;
  deUint32 dVar6;
  int iVar7;
  VkImageCreateFlags flags;
  VkImageType imageType;
  deUint32 numLayers;
  int iVar8;
  VkResult VVar9;
  int iVar10;
  MovePtr *vk_00;
  InstanceInterface *vki_00;
  VkDevice device_00;
  VkPhysicalDevice physDevice_00;
  VkQueue queue_00;
  TextureFormat format_00;
  size_type sVar11;
  NotSupportedError *this_00;
  Handle<(vk::HandleType)8> *pHVar12;
  Allocation *pAVar13;
  void *pvVar14;
  VkDeviceSize VVar15;
  ProgramCollection<vk::ProgramBinary> *pPVar16;
  ProgramBinary *pPVar17;
  Handle<(vk::HandleType)9> *pHVar18;
  const_reference src;
  Handle<(vk::HandleType)24> *pHVar19;
  VkCommandBuffer_s **ppVVar20;
  const_reference pvVar21;
  Handle<(vk::HandleType)16> *pHVar22;
  Handle<(vk::HandleType)14> *pHVar23;
  const_reference pvVar24;
  reference pvVar25;
  TestContext *pTVar26;
  TestLog *pTVar27;
  char *pcVar28;
  deUint32 numMipLevels_00;
  MovePtr *pMVar29;
  bool bVar30;
  VkImageSubresourceLayers VVar31;
  VkOffset3D VVar32;
  VkExtent3D VVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  bool local_d4a;
  allocator<char> local_a51;
  string local_a50;
  byte local_a2b;
  byte local_a2a;
  allocator<char> local_a29;
  string local_a28;
  Vector<unsigned_int,_4> local_a04;
  Vector<float,_4> local_9f4;
  undefined1 local_9e4 [11];
  undefined1 local_9d9;
  undefined1 local_9d8 [7];
  bool ok;
  undefined1 local_9b8 [8];
  string comparisonName;
  PixelBufferAccess expectedImage;
  TextureLevel textureLevel;
  ConstPixelBufferAccess resultImage;
  int levelDepth;
  void *pLevelData;
  IVec4 *mipSize_1;
  int mipLevel_2;
  bool allOk;
  VkDeviceSize levelOffset_1;
  TextureFormat format;
  undefined4 local_8e8 [2];
  VkBufferMemoryBarrier bufferBarriers [1];
  undefined1 local_88c [12];
  VkExtent3D local_880;
  deUint32 local_874;
  int mipLevel_1;
  VkExtent3D VStack_870;
  VkOffset3D local_860;
  undefined1 local_850 [8];
  VkBufferImageCopy workRegion;
  VkDeviceSize levelOffset;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> regions;
  VkImageMemoryBarrier imageBarriers_1 [1];
  Move<vk::VkCommandBuffer_s_*> local_7a0;
  RefData<vk::VkCommandBuffer_s_*> local_780;
  undefined1 local_760 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer_1;
  RefData<vk::Handle<(vk::HandleType)24>_> local_720;
  undefined1 local_700 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool_1;
  int levelSlices;
  IVec4 *mipSize;
  int mipLevel;
  deUint32 numImageBarriers;
  VkImageMemoryBarrier imageBarriers [2];
  Move<vk::VkCommandBuffer_s_*> local_5f8;
  RefData<vk::VkCommandBuffer_s_*> local_5d8;
  undefined1 local_5b8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_578;
  undefined1 local_558 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_520;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_510;
  Move<vk::Handle<(vk::HandleType)8>_> local_500;
  RefData<vk::Handle<(vk::HandleType)8>_> local_4e0;
  VkDeviceSize local_4c0;
  VkDeviceSize vertexBufferSize;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_490;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_480;
  Vector<int,_3> local_46c;
  Move<vk::Handle<(vk::HandleType)9>_> local_460;
  RefData<vk::Handle<(vk::HandleType)9>_> local_440;
  undefined4 local_420;
  deUint32 local_41c;
  VkImageUsageFlags imageUsage_1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_410;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_400;
  undefined1 local_3ec [12];
  Move<vk::Handle<(vk::HandleType)9>_> local_3e0;
  RefData<vk::Handle<(vk::HandleType)9>_> local_3c0;
  undefined4 local_39c;
  undefined1 local_398 [4];
  VkImageUsageFlags imageUsage;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> depthStencilImageAlloc;
  Move<vk::Handle<(vk::HandleType)9>_> depthStencilImage;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  Move<vk::Handle<(vk::HandleType)9>_> colorImage;
  RefData<vk::Handle<(vk::HandleType)16>_> local_2e8;
  undefined1 local_2c8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  string local_2a0;
  Move<vk::Handle<(vk::HandleType)14>_> local_280;
  RefData<vk::Handle<(vk::HandleType)14>_> local_260;
  undefined1 local_240 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentModule;
  string local_218;
  Move<vk::Handle<(vk::HandleType)14>_> local_1f8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_1d8;
  undefined1 local_1b8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexModule;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_180;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_170;
  undefined1 local_160 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_130;
  undefined1 local_110 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> colorBuffer;
  VkDeviceSize colorBufferSize;
  bool useDepthStencil;
  int numMipLevels;
  undefined1 local_c8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> mipLevelStorageSizes;
  undefined1 local_a0 [8];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> mipLevelSizes;
  undefined1 local_80 [4];
  deInt32 numSlices;
  IVec4 imageSize;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkPhysicalDevice physDevice;
  VkDevice device;
  InstanceInterface *vki;
  DeviceInterface *vk;
  CaseDef_conflict *caseDef_local;
  Context *context_local;
  
  checkImageViewTypeRequirements(context,caseDef->viewType);
  vk_00 = (MovePtr *)Context::getDeviceInterface(context);
  vki_00 = Context::getInstanceInterface(context);
  device_00 = Context::getDevice(context);
  physDevice_00 = Context::getPhysicalDevice(context);
  queue_00 = Context::getUniversalQueue(context);
  dVar6 = Context::getUniversalQueueFamilyIndex(context);
  imageSize.m_data._8_8_ = Context::getDefaultAllocator(context);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_80,&caseDef->imageSizeHint);
  mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       maxLayersOrDepth((Vector<int,_4> *)local_80);
  this = &mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)this,(Vector<int,_4> *)local_80);
  getMipLevelSizes((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a0,
                   (IVec4 *)this);
  format_00 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar7 = tcu::getPixelSize(format_00);
  getPerMipLevelStorageSize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,
             (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a0,
             (long)iVar7);
  sVar11 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::size
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a0
                     );
  numMipLevels_00 = (deUint32)sVar11;
  bVar30 = caseDef->depthStencilFormat != VK_FORMAT_UNDEFINED;
  if ((bVar30) &&
     (bVar5 = isDepthStencilFormatSupported(vki_00,physDevice_00,caseDef->depthStencilFormat),
     !bVar5)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Unsupported depth/stencil format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
               ,0x4ee);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       sum<unsigned_long>((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
             &colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.field_0x8,(DeviceInterface *)vk_00,device_00,
             (VkDeviceSize)
             colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator,2)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_130,
             (Move *)&colorBufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar34 = (undefined4)local_130.object.m_internal;
  uVar35 = (undefined4)(local_130.object.m_internal >> 0x20);
  uVar36 = SUB84(local_130.deleter.m_deviceIface,0);
  uVar37 = (undefined4)((ulong)local_130.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_deviceIface._0_4_ = uVar36;
  data_03.object.m_internal = local_130.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = uVar37;
  data_03.deleter.m_device._0_4_ = (int)local_130.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_130.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_130.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_130.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_110,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.field_0x8);
  uVar4 = imageSize.m_data._8_8_;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_110);
  pMVar29 = vk_00;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_180,
             (DeviceInterface *)vk_00,device_00,(Allocator *)uVar4,(VkBuffer)pHVar12->m_internal,
             ::vk::MemoryRequirement::HostVisible);
  local_170 = de::details::MovePtr::operator_cast_to_PtrData(&local_180,pMVar29);
  data.ptr._4_4_ = uVar35;
  data.ptr._0_4_ = uVar34;
  data._8_4_ = uVar36;
  data._12_4_ = uVar37;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_160,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_180);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_160)
  ;
  pvVar14 = ::vk::Allocation::getHostPtr(pAVar13);
  ::deMemset(pvVar14,0,
             (size_t)colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                     m_allocator);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_160)
  ;
  vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_160)
  ;
  VVar15 = ::vk::Allocation::getOffset(pAVar13);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)vk_00,device_00,
             (VkDeviceMemory)
             vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator,
             VVar15,0xffffffffffffffff);
  pPVar16 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"vert",
             (allocator<char> *)
             ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar17 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar16,&local_218);
  ::vk::createShaderModule(&local_1f8,(DeviceInterface *)vk_00,device_00,pPVar17,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1d8,(Move *)&local_1f8);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_1d8.deleter.m_deviceIface;
  data_04.object.m_internal = local_1d8.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1d8.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_1d8.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_1d8.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_1d8.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_1d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_1b8,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar16 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"frag",
             (allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar17 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar16,&local_2a0);
  ::vk::createShaderModule(&local_280,(DeviceInterface *)vk_00,device_00,pPVar17,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_260,(Move *)&local_280);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_260.deleter.m_deviceIface;
  data_05.object.m_internal = local_260.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_260.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_260.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_260.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_260.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_260.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_240,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)
                     &colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                      m_allocator,(DeviceInterface *)vk_00,device_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_2e8,
             (Move *)&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                      m_allocator);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_2e8.deleter.m_deviceIface;
  data_06.object.m_internal = local_2e8.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2e8.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_2e8.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_2e8.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_2e8.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_2e8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_2c8,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
              m_allocator);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &depthStencilImageAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_398);
  local_39c = 0x11;
  flags = getImageCreateFlags(caseDef->viewType);
  imageType = getImageType(caseDef->viewType);
  VVar1 = caseDef->colorFormat;
  tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)local_3ec,(int)local_80,0,1);
  numLayers = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_80);
  makeImage(&local_3e0,(DeviceInterface *)vk_00,device_00,flags,imageType,VVar1,(IVec3 *)local_3ec,
            numMipLevels_00,numLayers,0x11);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3c0,(Move *)&local_3e0);
  uVar34 = (undefined4)local_3c0.object.m_internal;
  uVar35 = (undefined4)(local_3c0.object.m_internal >> 0x20);
  uVar36 = SUB84(local_3c0.deleter.m_deviceIface,0);
  uVar37 = (undefined4)((ulong)local_3c0.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_deviceIface._0_4_ = uVar36;
  data_07.object.m_internal = local_3c0.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = uVar37;
  data_07.deleter.m_device._0_4_ = (int)local_3c0.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_3c0.deleter.m_device >> 0x20);
  data_07.deleter.m_allocator._0_4_ = (int)local_3c0.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_3c0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_3e0);
  uVar4 = imageSize.m_data._8_8_;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                       &colorImageAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  _imageUsage_1 = pHVar18->m_internal;
  local_41c = ::vk::MemoryRequirement::Any.m_flags;
  pMVar29 = vk_00;
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_410,
            (DeviceInterface *)vk_00,device_00,(Allocator *)uVar4,_imageUsage_1,
            ::vk::MemoryRequirement::Any);
  local_400 = de::details::MovePtr::operator_cast_to_PtrData(&local_410,pMVar29);
  data_00.ptr._4_4_ = uVar35;
  data_00.ptr._0_4_ = uVar34;
  data_00._8_4_ = uVar36;
  data_00._12_4_ = uVar37;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
              m_allocator,data_00);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_410);
  if (bVar30) {
    local_420 = 0x20;
    VVar1 = caseDef->depthStencilFormat;
    iVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_80);
    iVar8 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_80);
    tcu::Vector<int,_3>::Vector(&local_46c,iVar7,iVar8,1);
    makeImage(&local_460,(DeviceInterface *)vk_00,device_00,0,VK_IMAGE_TYPE_2D,VVar1,&local_46c,
              numMipLevels_00,
              mipLevelSizes.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage._4_4_,0x20);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_440,(Move *)&local_460);
    uVar34 = (undefined4)local_440.object.m_internal;
    uVar35 = (undefined4)(local_440.object.m_internal >> 0x20);
    uVar36 = SUB84(local_440.deleter.m_deviceIface,0);
    uVar37 = (undefined4)((ulong)local_440.deleter.m_deviceIface >> 0x20);
    data_08.deleter.m_deviceIface._0_4_ = uVar36;
    data_08.object.m_internal = local_440.object.m_internal;
    data_08.deleter.m_deviceIface._4_4_ = uVar37;
    data_08.deleter.m_device._0_4_ = (int)local_440.deleter.m_device;
    data_08.deleter.m_device._4_4_ = (int)((ulong)local_440.deleter.m_device >> 0x20);
    data_08.deleter.m_allocator._0_4_ = (int)local_440.deleter.m_allocator;
    data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_440.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=
              ((Move<vk::Handle<(vk::HandleType)9>_> *)
               &depthStencilImageAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8,data_08);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_460);
    uVar4 = imageSize.m_data._8_8_;
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &depthStencilImageAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    vertices.
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = ::vk::MemoryRequirement::Any.m_flags;
    pMVar29 = vk_00;
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_490,
              (DeviceInterface *)vk_00,device_00,(Allocator *)uVar4,(VkImage)pHVar18->m_internal,
              ::vk::MemoryRequirement::Any);
    local_480 = de::details::MovePtr::operator_cast_to_PtrData(&local_490,pMVar29);
    data_01.ptr._4_4_ = uVar35;
    data_01.ptr._0_4_ = uVar34;
    data_01._8_4_ = uVar36;
    data_01._12_4_ = uVar37;
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                m_allocator,data_01);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_490);
  }
  genFullQuadVertices((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       *)&vertexBufferSize,
                      mipLevelSizes.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  local_4c0 = sizeInBytes<vkt::pipeline::Vertex4RGBA>
                        ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          *)&vertexBufferSize);
  makeBuffer(&local_500,(DeviceInterface *)vk_00,device_00,local_4c0,0x80);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4e0,(Move *)&local_500);
  uVar34 = (undefined4)local_4e0.object.m_internal;
  uVar35 = (undefined4)(local_4e0.object.m_internal >> 0x20);
  uVar36 = SUB84(local_4e0.deleter.m_deviceIface,0);
  uVar37 = (undefined4)((ulong)local_4e0.deleter.m_deviceIface >> 0x20);
  data_09.deleter.m_deviceIface._0_4_ = uVar36;
  data_09.object.m_internal = local_4e0.object.m_internal;
  data_09.deleter.m_deviceIface._4_4_ = uVar37;
  data_09.deleter.m_device._0_4_ = (int)local_4e0.deleter.m_device;
  data_09.deleter.m_device._4_4_ = (int)((ulong)local_4e0.deleter.m_device >> 0x20);
  data_09.deleter.m_allocator._0_4_ = (int)local_4e0.deleter.m_allocator;
  data_09.deleter.m_allocator._4_4_ = (int)((ulong)local_4e0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,data_09);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_500);
  uVar4 = imageSize.m_data._8_8_;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &vertexBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  pMVar29 = vk_00;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_520,
             (DeviceInterface *)vk_00,device_00,(Allocator *)uVar4,(VkBuffer)pHVar12->m_internal,
             ::vk::MemoryRequirement::HostVisible);
  local_510 = de::details::MovePtr::operator_cast_to_PtrData(&local_520,pMVar29);
  data_02.ptr._4_4_ = uVar35;
  data_02.ptr._0_4_ = uVar34;
  data_02._8_4_ = uVar36;
  data_02._12_4_ = uVar37;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_398,data_02);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_520);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_398)
  ;
  pvVar14 = ::vk::Allocation::getHostPtr(pAVar13);
  src = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        operator[]((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    *)&vertexBufferSize,0);
  ::deMemcpy(pvVar14,src,local_4c0);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_398)
  ;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_398)
  ;
  VVar15 = ::vk::Allocation::getOffset(pAVar13);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)vk_00,device_00,
             (VkDeviceMemory)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             VVar15,local_4c0);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             &vertexBufferSize);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             (DeviceInterface *)vk_00,device_00,2,dVar6,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_578,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_10.deleter.m_deviceIface._0_4_ = (int)local_578.deleter.m_deviceIface;
  data_10.object.m_internal = local_578.object.m_internal;
  data_10.deleter.m_deviceIface._4_4_ = (int)((ulong)local_578.deleter.m_deviceIface >> 0x20);
  data_10.deleter.m_device._0_4_ = (int)local_578.deleter.m_device;
  data_10.deleter.m_device._4_4_ = (int)((ulong)local_578.deleter.m_device >> 0x20);
  data_10.deleter.m_allocator._0_4_ = (int)local_578.deleter.m_allocator;
  data_10.deleter.m_allocator._4_4_ = (int)((ulong)local_578.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_558,data_10);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_558);
  makeCommandBuffer(&local_5f8,(DeviceInterface *)vk_00,device_00,(VkCommandPool)pHVar19->m_internal
                   );
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5d8,(Move *)&local_5f8);
  data_11.deleter.m_deviceIface._0_4_ = (int)local_5d8.deleter.m_deviceIface;
  data_11.object = local_5d8.object;
  data_11.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5d8.deleter.m_deviceIface >> 0x20);
  data_11.deleter.m_device._0_4_ = (int)local_5d8.deleter.m_device;
  data_11.deleter.m_device._4_4_ = (int)((ulong)local_5d8.deleter.m_device >> 0x20);
  data_11.deleter.m_pool.m_internal._0_4_ = (int)local_5d8.deleter.m_pool.m_internal;
  data_11.deleter.m_pool.m_internal._4_4_ = (int)(local_5d8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_5b8,data_11);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_5f8);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5b8);
  beginCommandBuffer((DeviceInterface *)vk_00,*ppVVar20);
  mipLevel = 0x2d;
  imageBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageBarriers[0]._4_4_ = 0;
  imageBarriers[0].pNext._0_4_ = 0;
  imageBarriers[0].pNext._4_4_ = 0x100;
  imageBarriers[0].srcAccessMask = 0;
  imageBarriers[0].dstAccessMask = 2;
  imageBarriers[0].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageBarriers[0].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                       &colorImageAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  imageBarriers[0]._32_8_ = pHVar18->m_internal;
  imageBarriers[0].image.m_internal._0_4_ = 1;
  imageBarriers[0].image.m_internal._4_4_ = 0;
  imageBarriers[0].subresourceRange.baseMipLevel = 0;
  imageBarriers[0].subresourceRange.aspectMask = numMipLevels_00;
  imageBarriers[0].subresourceRange.levelCount = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_80);
  imageBarriers[0].subresourceRange.layerCount = 0x2d;
  imageBarriers[1].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageBarriers[1]._4_4_ = 0;
  imageBarriers[1].pNext._0_4_ = 0;
  imageBarriers[1].pNext._4_4_ = 0x400;
  imageBarriers[1].srcAccessMask = 0;
  imageBarriers[1].dstAccessMask = 3;
  imageBarriers[1].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageBarriers[1].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                       &depthStencilImageAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  imageBarriers[1]._32_8_ = pHVar18->m_internal;
  imageBarriers[1].image.m_internal._0_4_ = getFormatAspectFlags(caseDef->depthStencilFormat);
  imageBarriers[1].image.m_internal._4_4_ = 0;
  imageBarriers[1].subresourceRange.baseMipLevel = 0;
  imageBarriers[1].subresourceRange.levelCount =
       mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  imageBarriers[1].subresourceRange.aspectMask = numMipLevels_00;
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5b8);
  (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar20,1,0x80,0,0,0,0,0,bVar30 + 1,&mipLevel);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5b8);
  VVar9 = (*(*(_func_int ***)vk_00)[0x4a])(vk_00,*ppVVar20);
  ::vk::checkResult(VVar9,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                    ,0x557);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5b8);
  submitCommandsAndWait((DeviceInterface *)vk_00,device_00,queue_00,*ppVVar20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_5b8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_558);
  for (mipSize._0_4_ = 0; (int)mipSize < (int)numMipLevels_00; mipSize._0_4_ = (int)mipSize + 1) {
    pvVar21 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                        ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                         local_a0,(long)(int)mipSize);
    iVar7 = maxLayersOrDepth(pvVar21);
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &colorImageAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    colorImage_00.m_internal = pHVar18->m_internal;
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &depthStencilImageAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    depthStencilImage_00.m_internal = pHVar18->m_internal;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                         &vertexBufferAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    vertexBuffer_00.m_internal = pHVar12->m_internal;
    pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_2c8);
    pipelineLayout_00.m_internal = pHVar22->m_internal;
    pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_1b8);
    vertexModule_00.m_internal = pHVar23->m_internal;
    pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_240);
    cmdPool_1.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pHVar23->m_internal;
    drawToMipLevel(context,caseDef,(int)mipSize,pvVar21,iVar7,colorImage_00,depthStencilImage_00,
                   vertexBuffer_00,pipelineLayout_00,vertexModule_00,
                   (VkShaderModule)
                   cmdPool_1.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                   m_allocator);
  }
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer_1.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             (DeviceInterface *)vk_00,device_00,2,dVar6,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_720,
             (Move *)&cmdBuffer_1.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_12.deleter.m_deviceIface._0_4_ = (int)local_720.deleter.m_deviceIface;
  data_12.object.m_internal = local_720.object.m_internal;
  data_12.deleter.m_deviceIface._4_4_ = (int)((ulong)local_720.deleter.m_deviceIface >> 0x20);
  data_12.deleter.m_device._0_4_ = (int)local_720.deleter.m_device;
  data_12.deleter.m_device._4_4_ = (int)((ulong)local_720.deleter.m_device >> 0x20);
  data_12.deleter.m_allocator._0_4_ = (int)local_720.deleter.m_allocator;
  data_12.deleter.m_allocator._4_4_ = (int)((ulong)local_720.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_700,data_12);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer_1.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_700);
  makeCommandBuffer(&local_7a0,(DeviceInterface *)vk_00,device_00,(VkCommandPool)pHVar19->m_internal
                   );
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_780,(Move *)&local_7a0);
  data_13.deleter.m_deviceIface._0_4_ = (int)local_780.deleter.m_deviceIface;
  data_13.object = local_780.object;
  data_13.deleter.m_deviceIface._4_4_ = (int)((ulong)local_780.deleter.m_deviceIface >> 0x20);
  data_13.deleter.m_device._0_4_ = (int)local_780.deleter.m_device;
  data_13.deleter.m_device._4_4_ = (int)((ulong)local_780.deleter.m_device >> 0x20);
  data_13.deleter.m_pool.m_internal._0_4_ = (int)local_780.deleter.m_pool.m_internal;
  data_13.deleter.m_pool.m_internal._4_4_ = (int)(local_780.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_760,data_13);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_7a0);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
  beginCommandBuffer((DeviceInterface *)vk_00,*ppVVar20);
  regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x2d;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
             &colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  tcu::Vector<int,_4>::w((Vector<int,_4> *)local_80);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
  (*(*(_func_int ***)vk_00)[0x6d])
            (vk_00,*ppVVar20,0x400,0x1000,0,0,0,0,0,1,
             &regions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::vector
            ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)&levelOffset);
  workRegion.imageExtent.height = 0;
  workRegion.imageExtent.depth = 0;
  local_850 = (undefined1  [8])0x0;
  workRegion.bufferOffset._0_4_ = 0;
  workRegion.bufferOffset._4_4_ = 0;
  dVar6 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_80);
  VVar31 = ::vk::makeImageSubresourceLayers(1,0,0,dVar6);
  workRegion.bufferImageHeight = VVar31.mipLevel;
  VVar32 = ::vk::makeOffset3D(0,0,0);
  local_860.z = VVar32.z;
  workRegion.imageOffset.x = local_860.z;
  local_860._0_8_ = VVar32._0_8_;
  workRegion.imageSubresource.baseArrayLayer = local_860.x;
  workRegion.imageSubresource.layerCount = local_860.y;
  local_860 = VVar32;
  VStack_870 = ::vk::makeExtent3D(0,0,0);
  workRegion._36_12_ = VStack_870;
  for (local_874 = 0; (int)local_874 < (int)numMipLevels_00; local_874 = local_874 + 1) {
    local_850._0_4_ = workRegion.imageExtent.height;
    local_850._4_4_ = workRegion.imageExtent.depth;
    workRegion.bufferImageHeight = local_874;
    pvVar21 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                        ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                         local_a0,(long)(int)local_874);
    tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)local_88c,(int)pvVar21,0,1);
    VVar33 = ::vk::makeExtent3D((IVec3 *)local_88c);
    local_880 = VVar33;
    workRegion._36_12_ = VVar33;
    std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::push_back
              ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)&levelOffset
               ,(value_type *)local_850);
    pvVar24 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,
                         (long)(int)local_874);
    workRegion.imageExtent._4_8_ = *pvVar24 + workRegion.imageExtent._4_8_;
  }
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
  pVVar2 = *ppVVar20;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                       &colorImageAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  dVar3 = pHVar18->m_internal;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_110);
  bufferBarriers[0].size = pHVar12->m_internal;
  sVar11 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::size
                     ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                      &levelOffset);
  pvVar25 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::operator[]
                      ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                       &levelOffset,0);
  (*(*(_func_int ***)vk_00)[99])
            (vk_00,pVVar2,dVar3,6,bufferBarriers[0].size,sVar11 & 0xffffffff,(int)pvVar25);
  std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::~vector
            ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)&levelOffset);
  local_8e8[0] = 0x2c;
  bufferBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferBarriers[0]._4_4_ = 0;
  bufferBarriers[0].pNext._0_4_ = 0x1000;
  bufferBarriers[0].pNext._4_4_ = 0x2000;
  bufferBarriers[0].srcAccessMask = 0xffffffff;
  bufferBarriers[0].dstAccessMask = 0xffffffff;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_110);
  bufferBarriers[0]._24_8_ = pHVar12->m_internal;
  bufferBarriers[0].buffer.m_internal = 0;
  bufferBarriers[0].offset = 0xffffffffffffffff;
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
  (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar20,0x1000,0x4000,0,0,0,1,(int)local_8e8,0,0);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
  VVar9 = (*(*(_func_int ***)vk_00)[0x4a])(vk_00,*ppVVar20);
  ::vk::checkResult(VVar9,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                    ,0x5b4);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
  submitCommandsAndWait((DeviceInterface *)vk_00,device_00,queue_00,*ppVVar20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_760);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_700);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_160)
  ;
  format = (TextureFormat)::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_160)
  ;
  VVar15 = ::vk::Allocation::getOffset(pAVar13);
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)vk_00,device_00,(VkDeviceMemory)format,VVar15,0xffffffffffffffff);
  levelOffset_1 = (VkDeviceSize)::vk::mapVkFormat(caseDef->colorFormat);
  _mipLevel_2 = 0;
  mipSize_1._7_1_ = 1;
  for (mipSize_1._0_4_ = 0; (int)mipSize_1 < (int)numMipLevels_00;
      mipSize_1._0_4_ = (int)mipSize_1 + 1) {
    pvVar21 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                        ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                         local_a0,(long)(int)mipSize_1);
    pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_160);
    pvVar14 = ::vk::Allocation::getHostPtr(pAVar13);
    pvVar14 = (void *)((long)pvVar14 + _mipLevel_2);
    iVar7 = maxLayersOrDepth(pvVar21);
    iVar8 = tcu::Vector<int,_4>::x(pvVar21);
    iVar10 = tcu::Vector<int,_4>::y(pvVar21);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&textureLevel.m_data.m_cap,(TextureFormat *)&levelOffset_1,
               iVar8,iVar10,iVar7,pvVar14);
    iVar8 = tcu::Vector<int,_4>::x(pvVar21);
    iVar10 = tcu::Vector<int,_4>::y(pvVar21);
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)&expectedImage.super_ConstPixelBufferAccess.m_data,
               (TextureFormat *)&levelOffset_1,iVar8,iVar10,iVar7);
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)((long)&comparisonName.field_2 + 8),
               (TextureLevel *)&expectedImage.super_ConstPixelBufferAccess.m_data);
    de::toString<int>((string *)local_9d8,(int *)&mipSize_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b8,
                   "Mip level ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d8);
    std::__cxx11::string::~string((string *)local_9d8);
    local_9d9 = 0;
    tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)local_9e4,(int)pvVar21,0);
    generateExpectedImage
              ((PixelBufferAccess *)((long)&comparisonName.field_2 + 8),(IVec2 *)local_9e4,0);
    bVar30 = ::vk::isFloatFormat(caseDef->colorFormat);
    if (bVar30) {
      pTVar26 = Context::getTestContext(context);
      pTVar27 = tcu::TestContext::getLog(pTVar26);
      pcVar28 = (char *)std::__cxx11::string::c_str();
      tcu::Vector<float,_4>::Vector(&local_9f4,0.01);
      local_9d9 = tcu::floatThresholdCompare
                            (pTVar27,"Image Comparison",pcVar28,
                             (ConstPixelBufferAccess *)((long)&comparisonName.field_2 + 8),
                             (ConstPixelBufferAccess *)&textureLevel.m_data.m_cap,&local_9f4,
                             COMPARE_LOG_RESULT);
    }
    else {
      pTVar26 = Context::getTestContext(context);
      pTVar27 = tcu::TestContext::getLog(pTVar26);
      pcVar28 = (char *)std::__cxx11::string::c_str();
      tcu::Vector<unsigned_int,_4>::Vector(&local_a04,2);
      local_9d9 = tcu::intThresholdCompare
                            (pTVar27,"Image Comparison",pcVar28,
                             (ConstPixelBufferAccess *)((long)&comparisonName.field_2 + 8),
                             (ConstPixelBufferAccess *)&textureLevel.m_data.m_cap,&local_a04,
                             COMPARE_LOG_RESULT);
    }
    local_d4a = false;
    if ((mipSize_1._7_1_ & 1) != 0) {
      local_d4a = (bool)local_9d9;
    }
    mipSize_1._7_1_ = local_d4a;
    pvVar24 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,
                         (long)(int)mipSize_1);
    _mipLevel_2 = *pvVar24 + _mipLevel_2;
    std::__cxx11::string::~string((string *)local_9b8);
    tcu::TextureLevel::~TextureLevel
              ((TextureLevel *)&expectedImage.super_ConstPixelBufferAccess.m_data);
  }
  local_a2a = 0;
  local_a2b = 0;
  if ((mipSize_1._7_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a50,"Fail",&local_a51);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_a50);
    std::__cxx11::string::~string((string *)&local_a50);
    std::allocator<char>::~allocator(&local_a51);
  }
  else {
    std::allocator<char>::allocator();
    local_a2a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a28,"Pass",&local_a29);
    local_a2b = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_a28);
  }
  if ((local_a2b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a28);
  }
  if ((local_a2a & 1) != 0) {
    std::allocator<char>::~allocator(&local_a29);
  }
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_398);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &depthStencilImageAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
              m_allocator);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_2c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_240);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_1b8);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_160);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_110);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testRenderToMipMaps (Context& context, const CaseDef caseDef)
{
	checkImageViewTypeRequirements(context, caseDef.viewType);

	const DeviceInterface&			vk					= context.getDeviceInterface();
	const InstanceInterface&		vki					= context.getInstanceInterface();
	const VkDevice					device				= context.getDevice();
	const VkPhysicalDevice			physDevice			= context.getPhysicalDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	const IVec4						imageSize				= caseDef.imageSizeHint;	// MAX_SIZE is not used in this test
	const deInt32					numSlices				= maxLayersOrDepth(imageSize);
	const vector<IVec4>				mipLevelSizes			= getMipLevelSizes(imageSize);
	const vector<VkDeviceSize>		mipLevelStorageSizes	= getPerMipLevelStorageSize(mipLevelSizes, tcu::getPixelSize(mapVkFormat(caseDef.colorFormat)));
	const int						numMipLevels			= static_cast<int>(mipLevelSizes.size());
	const bool						useDepthStencil			= (caseDef.depthStencilFormat != VK_FORMAT_UNDEFINED);

	if (useDepthStencil && !isDepthStencilFormatSupported(vki, physDevice, caseDef.depthStencilFormat))
		TCU_THROW(NotSupportedError, "Unsupported depth/stencil format");

	// Create a color buffer big enough to hold all layers and mip levels
	const VkDeviceSize				colorBufferSize		= sum(mipLevelStorageSizes);
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	{
		deMemset(colorBufferAlloc->getHostPtr(), 0, static_cast<std::size_t>(colorBufferSize));
		flushMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
	}

	const Unique<VkShaderModule>	vertexModule		(createShaderModule	(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	fragmentModule		(createShaderModule	(vk, device, context.getBinaryCollection().get("frag"), 0u));
	const Unique<VkPipelineLayout>	pipelineLayout		(makePipelineLayout	(vk, device));

	Move<VkImage>					colorImage;
	MovePtr<Allocation>				colorImageAlloc;
	Move<VkImage>					depthStencilImage;
	MovePtr<Allocation>				depthStencilImageAlloc;
	Move<VkBuffer>					vertexBuffer;
	MovePtr<Allocation>				vertexBufferAlloc;

	// Create a color image
	{
		const VkImageUsageFlags	imageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

		colorImage		= makeImage(vk, device, getImageCreateFlags(caseDef.viewType), getImageType(caseDef.viewType), caseDef.colorFormat,
									imageSize.swizzle(0, 1, 2), numMipLevels, imageSize.w(), imageUsage);
		colorImageAlloc	= bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any);
	}

	// Create a depth/stencil image (always a 2D image, optionally layered)
	if (useDepthStencil)
	{
		const VkImageUsageFlags	imageUsage	= VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT;

		depthStencilImage		= makeImage(vk, device, (VkImageCreateFlags)0, VK_IMAGE_TYPE_2D, caseDef.depthStencilFormat,
											IVec3(imageSize.x(), imageSize.y(), 1), numMipLevels, numSlices, imageUsage);
		depthStencilImageAlloc	= bindImage(vk, device, allocator, *depthStencilImage, MemoryRequirement::Any);
	}

	// Create a vertex buffer
	{
		const vector<Vertex4RGBA>	vertices			= genFullQuadVertices(numSlices);
		const VkDeviceSize			vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);
		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// Prepare images
	{
		const Unique<VkCommandPool>		cmdPool		(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer	(makeCommandBuffer(vk, device, *cmdPool));

		beginCommandBuffer(vk, *cmdBuffer);

		const VkImageMemoryBarrier	imageBarriers[]	=
		{
			{
				VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType            sType;
				DE_NULL,											// const void*                pNext;
				(VkAccessFlags)0,									// VkAccessFlags              srcAccessMask;
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags              dstAccessMask;
				VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout              oldLayout;
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout              newLayout;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   dstQueueFamilyIndex;
				*colorImage,										// VkImage                    image;
				{													// VkImageSubresourceRange    subresourceRange;
					VK_IMAGE_ASPECT_COLOR_BIT,							// VkImageAspectFlags    aspectMask;
					0u,													// uint32_t              baseMipLevel;
					static_cast<deUint32>(numMipLevels),				// uint32_t              levelCount;
					0u,													// uint32_t              baseArrayLayer;
					static_cast<deUint32>(imageSize.w()),				// uint32_t              layerCount;
				},
			},
			{
				VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType            sType;
				DE_NULL,											// const void*                pNext;
				(VkAccessFlags)0,									// VkAccessFlags              srcAccessMask;
				VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT,		// VkAccessFlags              dstAccessMask;
				VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout              oldLayout;
				VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout              newLayout;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   dstQueueFamilyIndex;
				*depthStencilImage,									// VkImage                    image;
				{													// VkImageSubresourceRange    subresourceRange;
					getFormatAspectFlags(caseDef.depthStencilFormat),	// VkImageAspectFlags    aspectMask;
					0u,													// uint32_t              baseMipLevel;
					static_cast<deUint32>(numMipLevels),				// uint32_t              levelCount;
					0u,													// uint32_t              baseArrayLayer;
					static_cast<deUint32>(numSlices),					// uint32_t              layerCount;
				},
			}
		};

		const deUint32	numImageBarriers = static_cast<deUint32>(DE_LENGTH_OF_ARRAY(imageBarriers) - (useDepthStencil ? 0 : 1));

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
								0u, DE_NULL, 0u, DE_NULL, numImageBarriers, imageBarriers);

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Draw
	for (int mipLevel = 0; mipLevel < numMipLevels; ++mipLevel)
	{
		const IVec4&	mipSize		= mipLevelSizes[mipLevel];
		const int		levelSlices	= maxLayersOrDepth(mipSize);

		drawToMipLevel (context, caseDef, mipLevel, mipSize, levelSlices, *colorImage, *depthStencilImage, *vertexBuffer, *pipelineLayout,
						*vertexModule, *fragmentModule);
	}

	// Copy results: colorImage -> host visible colorBuffer
	{
		const Unique<VkCommandPool>		cmdPool		(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer	(makeCommandBuffer(vk, device, *cmdPool));

		beginCommandBuffer(vk, *cmdBuffer);

		{
			const VkImageMemoryBarrier	imageBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType            sType;
					DE_NULL,										// const void*                pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags              srcAccessMask;
					VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags              dstAccessMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout              oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,			// VkImageLayout              newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t                   srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t                   dstQueueFamilyIndex;
					*colorImage,									// VkImage                    image;
					{												// VkImageSubresourceRange    subresourceRange;
						VK_IMAGE_ASPECT_COLOR_BIT,							// VkImageAspectFlags    aspectMask;
						0u,													// uint32_t              baseMipLevel;
						static_cast<deUint32>(numMipLevels),				// uint32_t              levelCount;
						0u,													// uint32_t              baseArrayLayer;
						static_cast<deUint32>(imageSize.w()),				// uint32_t              layerCount;
					},
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
									0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(imageBarriers), imageBarriers);
		}
		{
			vector<VkBufferImageCopy>	regions;
			VkDeviceSize				levelOffset = 0ull;
			VkBufferImageCopy			workRegion	=
			{
				0ull,																				// VkDeviceSize                bufferOffset;
				0u,																					// uint32_t                    bufferRowLength;
				0u,																					// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, imageSize.w()),		// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),																// VkOffset3D                  imageOffset;
				makeExtent3D(0, 0, 0),																// VkExtent3D                  imageExtent;
			};

			for (int mipLevel = 0; mipLevel < numMipLevels; ++mipLevel)
			{
				workRegion.bufferOffset					= levelOffset;
				workRegion.imageSubresource.mipLevel	= static_cast<deUint32>(mipLevel);
				workRegion.imageExtent					= makeExtent3D(mipLevelSizes[mipLevel].swizzle(0, 1, 2));

				regions.push_back(workRegion);

				levelOffset += mipLevelStorageSizes[mipLevel];
			}

			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, static_cast<deUint32>(regions.size()), &regions[0]);
		}
		{
			const VkBufferMemoryBarrier	bufferBarriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
									0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify results (per mip level)
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);

		const tcu::TextureFormat			format			= mapVkFormat(caseDef.colorFormat);

		VkDeviceSize						levelOffset		= 0ull;
		bool								allOk			= true;

		for (int mipLevel = 0; mipLevel < numMipLevels; ++mipLevel)
		{
			const IVec4&						mipSize			= mipLevelSizes[mipLevel];
			const void*	const					pLevelData		= static_cast<const deUint8*>(colorBufferAlloc->getHostPtr()) + levelOffset;
			const int							levelDepth		= maxLayersOrDepth(mipSize);
			const tcu::ConstPixelBufferAccess	resultImage		(format, mipSize.x(), mipSize.y(), levelDepth, pLevelData);
			tcu::TextureLevel					textureLevel	(format, mipSize.x(), mipSize.y(), levelDepth);
			const tcu::PixelBufferAccess		expectedImage	= textureLevel.getAccess();
			const std::string					comparisonName	= "Mip level " + de::toString(mipLevel);
			bool								ok				= false;

			generateExpectedImage(expectedImage, mipSize.swizzle(0, 1), 0);

			if (isFloatFormat(caseDef.colorFormat))
				ok = tcu::floatThresholdCompare(context.getTestContext().getLog(), "Image Comparison", comparisonName.c_str(), expectedImage, resultImage, tcu::Vec4(0.01f), tcu::COMPARE_LOG_RESULT);
			else
				ok = tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", comparisonName.c_str(), expectedImage, resultImage, tcu::UVec4(2), tcu::COMPARE_LOG_RESULT);

			allOk		=  allOk && ok;	// keep testing all levels, even if we know it's a fail overall
			levelOffset += mipLevelStorageSizes[mipLevel];
		}

		return allOk ? tcu::TestStatus::pass("Pass") : tcu::TestStatus::fail("Fail");
	}
}